

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

int __thiscall
TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontNonSym<std::complex<float>_>_>
::Subst_Forward(TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontNonSym<std::complex<float>_>_>
                *this,TPZFMatrix<std::complex<float>_> *b)

{
  long in_RDI;
  DecomposeType dec;
  DecomposeType in_stack_00003354;
  TPZFMatrix<std::complex<float>_> *in_stack_00003358;
  TPZFileEqnStorage<std::complex<float>_> *in_stack_00003360;
  
  std::operator<<((ostream *)&std::cout,"Entering Forward Substitution\n");
  std::ostream::flush();
  TPZFront<std::complex<float>_>::GetDecomposeType
            ((TPZFront<std::complex<float>_> *)(in_RDI + 0xd8));
  TPZFileEqnStorage<std::complex<float>_>::Forward
            (in_stack_00003360,in_stack_00003358,in_stack_00003354);
  return 1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::Subst_Forward(TPZFMatrix<TVar> *b) const {
	cout << "Entering Forward Substitution\n";
	cout.flush();
	DecomposeType dec = fFront.GetDecomposeType();
//	if(dec != ECholesky) cout << "TPZFrontMatrix::Subst_Forward non matching decomposition\n";
	fStorage.Forward(*b, dec);
	return 1;
}